

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O3

void __thiscall FIX::SessionState::onIncoming(SessionState *this,string *string)

{
  int iVar1;
  
  if (this->m_pLog != (Log *)0x0) {
    Mutex::lock(&this->m_mutex);
    (*this->m_pLog->_vptr_Log[4])(this->m_pLog,string);
    iVar1 = (this->m_mutex).m_count;
    (this->m_mutex).m_count = iVar1 + -1;
    if (iVar1 < 2) {
      (this->m_mutex).m_threadID = 0;
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
      return;
    }
  }
  return;
}

Assistant:

void onIncoming(const std::string &string) {
    if (!m_pLog) {
      return;
    }
    Locker l(m_mutex);
    m_pLog->onIncoming(string);
  }